

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen_qualities.cpp
# Opt level: O0

Read<signed_char> __thiscall
Omega_h::filter_coarsen_dirs(Omega_h *this,Read<signed_char> *codes,Read<signed_char> *keep_dirs)

{
  void *extraout_RDX;
  Read<signed_char> RVar1;
  Write<signed_char> local_e0;
  undefined1 local_d0 [8];
  type f;
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [8];
  Write<signed_char> codes_w;
  Read<signed_char> *keep_dirs_local;
  Read<signed_char> *codes_local;
  LO local_20;
  LO local_10;
  
  if (((ulong)(codes->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = (LO)((codes->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (LO)((ulong)(codes->write_).shared_alloc_.alloc >> 3);
  }
  codes_w.shared_alloc_.direct_ptr = keep_dirs;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"",&local_89);
  Write<signed_char>::Write((Write<signed_char> *)local_68,local_10,(string *)local_88);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  Read<signed_char>::Read((Read<signed_char> *)local_d0,codes);
  Read<signed_char>::Read((Read<signed_char> *)&f.codes.write_.shared_alloc_.direct_ptr,keep_dirs);
  Write<signed_char>::Write
            ((Write<signed_char> *)&f.keep_dirs.write_.shared_alloc_.direct_ptr,
             (Write<signed_char> *)local_68);
  if (((ulong)local_68 & 1) == 0) {
    local_20 = (LO)*(size_t *)local_68;
  }
  else {
    local_20 = (LO)((ulong)local_68 >> 3);
  }
  parallel_for<Omega_h::filter_coarsen_dirs(Omega_h::Read<signed_char>,Omega_h::Read<signed_char>)::__0>
            (local_20,(type *)local_d0,"filter_coarsen_dirs");
  Write<signed_char>::Write(&local_e0,(Write<signed_char> *)local_68);
  Read<signed_char>::Read((Read<signed_char> *)this,&local_e0);
  Write<signed_char>::~Write(&local_e0);
  filter_coarsen_dirs(Omega_h::Read<signed_char>,Omega_h::Read<signed_char>)::$_0::~__0
            ((__0 *)local_d0);
  Write<signed_char>::~Write((Write<signed_char> *)local_68);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar1.write_.shared_alloc_;
}

Assistant:

Read<I8> filter_coarsen_dirs(Read<I8> codes, Read<I8> keep_dirs) {
  auto codes_w = Write<I8>(codes.size());
  auto f = OMEGA_H_LAMBDA(LO cand) {
    auto code = codes[cand];
    for (Int dir = 0; dir < 2; ++dir) {
      if (!keep_dirs[cand * 2 + dir]) {
        code = dont_collapse(code, dir);
      }
    }
    codes_w[cand] = code;
  };
  parallel_for(codes_w.size(), f, "filter_coarsen_dirs");
  return codes_w;
}